

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinflate.c
# Opt level: O0

int tinf_uncompress(void *dest,uint *destLen,void *source,uint sourceLen)

{
  uint uVar1;
  uint uVar2;
  int local_53c;
  int res;
  uint btype;
  int bfinal;
  tinf_data d;
  uint sourceLen_local;
  void *source_local;
  uint *destLen_local;
  void *dest_local;
  
  d.source = (uchar *)((long)source + (ulong)sourceLen);
  d.source_end._0_4_ = 0;
  d.source_end._4_4_ = 0;
  d.tag = 0;
  d.dest = (uchar *)((long)dest + (ulong)*destLen);
  _btype = (uchar *)source;
  d._24_8_ = dest;
  d.dest_start = (uchar *)dest;
  d.dtree.max_sym = sourceLen;
  while( true ) {
    uVar1 = tinf_getbits((tinf_data *)&btype,1);
    uVar2 = tinf_getbits((tinf_data *)&btype,2);
    if (uVar2 == 0) {
      local_53c = tinf_inflate_uncompressed_block((tinf_data *)&btype);
    }
    else if (uVar2 == 1) {
      local_53c = tinf_inflate_fixed_block((tinf_data *)&btype);
    }
    else if (uVar2 == 2) {
      local_53c = tinf_inflate_dynamic_block((tinf_data *)&btype);
    }
    else {
      local_53c = -3;
    }
    if (local_53c != 0) break;
    if (uVar1 != 0) {
      if (d.tag == 0) {
        *destLen = (int)d.dest_start - d.overflow;
        dest_local._4_4_ = 0;
      }
      else {
        dest_local._4_4_ = -3;
      }
      return dest_local._4_4_;
    }
  }
  return local_53c;
}

Assistant:

int tinf_uncompress(void *dest, unsigned int *destLen,
                    const void *source, unsigned int sourceLen)
{
	struct tinf_data d;
	int bfinal;

	/* Initialise data */
	d.source = (const unsigned char *) source;
	d.source_end = d.source + sourceLen;
	d.tag = 0;
	d.bitcount = 0;
	d.overflow = 0;

	d.dest = (unsigned char *) dest;
	d.dest_start = d.dest;
	d.dest_end = d.dest + *destLen;

	do {
		unsigned int btype;
		int res;

		/* Read final block flag */
		bfinal = tinf_getbits(&d, 1);

		/* Read block type (2 bits) */
		btype = tinf_getbits(&d, 2);

		/* Decompress block */
		switch (btype) {
		case 0:
			/* Decompress uncompressed block */
			res = tinf_inflate_uncompressed_block(&d);
			break;
		case 1:
			/* Decompress block with fixed Huffman trees */
			res = tinf_inflate_fixed_block(&d);
			break;
		case 2:
			/* Decompress block with dynamic Huffman trees */
			res = tinf_inflate_dynamic_block(&d);
			break;
		default:
			res = TINF_DATA_ERROR;
			break;
		}

		if (res != TINF_OK) {
			return res;
		}
	} while (!bfinal);

	/* Check for overflow in bit reader */
	if (d.overflow) {
		return TINF_DATA_ERROR;
	}

	*destLen = d.dest - d.dest_start;

	return TINF_OK;
}